

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

string * cmExtraEclipseCDT4Generator::GetPathBasename(string *__return_storage_ptr__,string *path)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  string local_58 [32];
  long local_38;
  size_type loc;
  undefined1 local_19;
  string *local_18;
  string *path_local;
  string *outputBasename;
  
  local_19 = 0;
  local_18 = path;
  path_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    bVar3 = false;
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      bVar3 = true;
      if (*pcVar2 != '/') {
        std::__cxx11::string::size();
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        bVar3 = *pcVar2 == '\\';
      }
    }
    if (!bVar3) break;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  local_38 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0x97936a);
  if (local_38 != -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraEclipseCDT4Generator::GetPathBasename(const std::string& path)
{
  std::string outputBasename = path;
  while (!outputBasename.empty() &&
         (outputBasename[outputBasename.size() - 1] == '/' ||
          outputBasename[outputBasename.size() - 1] == '\\'))
    {
    outputBasename.resize(outputBasename.size() - 1);
    }
  std::string::size_type loc = outputBasename.find_last_of("/\\");
  if (loc != std::string::npos)
    {
    outputBasename = outputBasename.substr(loc + 1);
    }

  return outputBasename;
}